

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialize_parsed_expression.cpp
# Opt level: O0

unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
duckdb::OperatorExpression::Deserialize(Deserializer *deserializer)

{
  ExpressionType EVar1;
  void *pvVar2;
  unique_ptr<duckdb::OperatorExpression,_std::default_delete<duckdb::OperatorExpression>,_true>
  *in_RSI;
  ParsedExpression *in_RDI;
  unique_ptr<duckdb::OperatorExpression,_std::default_delete<duckdb::OperatorExpression>,_true>
  result;
  nullptr_t in_stack_ffffffffffffff78;
  pointer pOVar3;
  unique_ptr<duckdb::OperatorExpression,_std::default_delete<duckdb::OperatorExpression>,_true>
  *in_stack_ffffffffffffff80;
  _Head_base<0UL,_duckdb::ParsedExpression_*,_false> left;
  field_id_t field_id;
  undefined6 in_stack_ffffffffffffffc0;
  undefined1 uVar4;
  undefined1 local_18 [24];
  
  left._M_head_impl = in_RDI;
  local_18._8_8_ = in_RSI;
  pvVar2 = operator_new(0x50);
  field_id = (field_id_t)((ulong)pvVar2 >> 0x30);
  uVar4 = 1;
  EVar1 = Deserializer::Get<duckdb::ExpressionType>((Deserializer *)0xadeeff);
  unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>::
  unique_ptr<std::default_delete<duckdb::ParsedExpression>,void>
            ((unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
              *)in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
  unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>::
  unique_ptr<std::default_delete<duckdb::ParsedExpression>,void>
            ((unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
              *)in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
  OperatorExpression((OperatorExpression *)CONCAT17(uVar4,CONCAT16(EVar1,in_stack_ffffffffffffffc0))
                     ,(ExpressionType)(field_id >> 8),
                     (unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                      *)left._M_head_impl,
                     (unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                      *)in_RDI);
  uVar4 = 0;
  pOVar3 = (pointer)local_18;
  unique_ptr<duckdb::OperatorExpression,std::default_delete<duckdb::OperatorExpression>,true>::
  unique_ptr<std::default_delete<duckdb::OperatorExpression>,void>(in_stack_ffffffffffffff80,pOVar3)
  ;
  unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>::
  ~unique_ptr((unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
               *)0xadef70);
  unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>::
  ~unique_ptr((unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
               *)0xadef7a);
  unique_ptr<duckdb::OperatorExpression,_std::default_delete<duckdb::OperatorExpression>,_true>::
  operator->((unique_ptr<duckdb::OperatorExpression,_std::default_delete<duckdb::OperatorExpression>,_true>
              *)local_18._8_8_);
  Deserializer::
  ReadPropertyWithDefault<duckdb::vector<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>,true>>
            ((Deserializer *)CONCAT17(uVar4,CONCAT16(EVar1,in_stack_ffffffffffffffc0)),field_id,
             (char *)left._M_head_impl,
             (vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_true>
              *)in_RDI);
  unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>::
  unique_ptr<duckdb::OperatorExpression,std::default_delete<std::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>>>,void>
            ((unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
              *)local_18._8_8_,
             (unique_ptr<duckdb::OperatorExpression,_std::default_delete<duckdb::OperatorExpression>_>
              *)pOVar3);
  unique_ptr<duckdb::OperatorExpression,_std::default_delete<duckdb::OperatorExpression>,_true>::
  ~unique_ptr((unique_ptr<duckdb::OperatorExpression,_std::default_delete<duckdb::OperatorExpression>,_true>
               *)0xadefce);
  return (unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>)
         (_Tuple_impl<0UL,_duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>
          )left._M_head_impl;
}

Assistant:

unique_ptr<ParsedExpression> OperatorExpression::Deserialize(Deserializer &deserializer) {
	auto result = duckdb::unique_ptr<OperatorExpression>(new OperatorExpression(deserializer.Get<ExpressionType>()));
	deserializer.ReadPropertyWithDefault<vector<unique_ptr<ParsedExpression>>>(200, "children", result->children);
	return std::move(result);
}